

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesFabricPortGetMultiPortThroughputPrologue
          (ZESParameterValidation *this,zes_device_handle_t hDevice,uint32_t numPorts,
          zes_fabric_port_handle_t *phPort,zes_fabric_port_throughput_t **pThroughput)

{
  ze_result_t zVar1;
  
  if (hDevice == (zes_device_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (phPort != (zes_fabric_port_handle_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (pThroughput != (zes_fabric_port_throughput_t **)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesFabricPortGetMultiPortThroughputPrologue(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phPort )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pThroughput )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }